

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

bit_reader_t * bit_reader_create(uint8_t *bytes,size_t len)

{
  bit_reader_t *pbVar1;
  
  pbVar1 = (bit_reader_t *)calloc(1,0x28);
  if (bit_reader_create_reverse_table_created == '\0') {
    create_reverse_table();
    bit_reader_create_reverse_table_created = '\x01';
  }
  if (bytes != (uint8_t *)0x0) {
    pbVar1->bytes = bytes;
    pbVar1->len = len;
    pbVar1->current_byte_len = 8;
    pbVar1->current_byte = *bytes;
  }
  return pbVar1;
}

Assistant:

bit_reader_t *bit_reader_create(const uint8_t *bytes, size_t len) {
    bit_reader_t *r = calloc(1, sizeof(bit_reader_t));

    static bool reverse_table_created = false;

    if (!reverse_table_created) {
        create_reverse_table();
        reverse_table_created = true;
    }

    if (bytes) {
        bit_reader_reconfigure(r, bytes, len);
    }

    return r;
}